

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  loader_life_support *plVar1;
  __node_base *p_Var2;
  
  plVar1 = get_stack_top();
  if (plVar1 == this) {
    set_stack_top(this->parent);
    p_Var2 = &(this->keep_alive)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      _Py_DECREF((PyObject *)p_Var2[1]._M_nxt);
    }
    std::
    _Hashtable<_object_*,__object_*,_std::allocator<_object_*>,_std::__detail::_Identity,_std::equal_to<_object_*>,_std::hash<_object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(this->keep_alive)._M_h);
    return;
  }
  pybind11_fail("loader_life_support: internal error");
}

Assistant:

~loader_life_support() {
        if (get_stack_top() != this) {
            pybind11_fail("loader_life_support: internal error");
        }
        set_stack_top(parent);
        for (auto *item : keep_alive) {
            Py_DECREF(item);
        }
    }